

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMixedHybridMeshControl::AdjustBoundaryConditionsOfFractures(TPZMHMixedHybridMeshControl *this)

{
  int iVar1;
  int iVar2;
  TPZGeoMesh *this_00;
  int64_t iVar3;
  TPZGeoEl *this_01;
  TPZGeoMesh *in_RDI;
  TPZGeoEl *gel;
  int64_t el;
  int64_t nel;
  int meshdim;
  TPZGeoEl *in_stack_000003a8;
  TPZMHMixedHybridMeshControl *in_stack_000003b0;
  int64_t in_stack_ffffffffffffffc8;
  TPZCompMesh *in_stack_ffffffffffffffe0;
  long lVar4;
  
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)&in_RDI->fName);
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_ffffffffffffffe0);
  TPZAutoPointer<TPZCompMesh>::operator->
            ((TPZAutoPointer<TPZCompMesh> *)&(in_RDI->fNodeVec).fNFree.super_TPZVec<int>.fNAlloc);
  TPZCompMesh::LoadReferences(in_stack_ffffffffffffffe0);
  this_00 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)&in_RDI->fName);
  iVar1 = TPZGeoMesh::Dimension(this_00);
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)&in_RDI->fName);
  iVar3 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1e3434d);
  for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)&in_RDI->fName);
    this_01 = TPZGeoMesh::Element(in_RDI,in_stack_ffffffffffffffc8);
    if (this_01 != (TPZGeoEl *)0x0) {
      iVar2 = (**(code **)(*(long *)this_01 + 0x210))();
      if (iVar2 == iVar1 + -2) {
        iVar2 = TPZGeoEl::MaterialId(this_01);
        if (iVar2 == *(int *)&(in_RDI->fElementVec).fNFree.super_TPZVec<int>.fStore) {
          ApplyNeighbourBoundaryCondition(in_stack_000003b0,in_stack_000003a8);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::AdjustBoundaryConditionsOfFractures()
{
    fGMesh->ResetReference();
    fFluxMesh->LoadReferences();
    int meshdim = fGMesh->Dimension();
    int64_t nel = fGMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if(gel && gel->Dimension() == meshdim-2 && gel->MaterialId() == fBoundaryWrapMatId)
        {
            ApplyNeighbourBoundaryCondition(gel);
        }
    }
}